

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpu_data.h
# Opt level: O0

void * dlib::memcpy(void *__dest,void *__src,size_t __n)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  unsigned_long *puVar6;
  float *pfVar7;
  float *pfVar8;
  size_t sVar9;
  void *in_RCX;
  size_t in_R8;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  gpu_data *in_stack_fffffffffffffb90;
  gpu_data *this;
  string *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  error_type t;
  fatal_error *in_stack_fffffffffffffbb0;
  unsigned_long uVar10;
  ostringstream local_350 [383];
  undefined1 local_1d1;
  ostringstream local_1a0 [376];
  size_t local_28;
  void *local_20;
  gpu_data *local_18;
  void *local_10;
  gpu_data *local_8;
  
  t = (error_type)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = (gpu_data *)__n;
  local_10 = __src;
  local_8 = (gpu_data *)__dest;
  sVar1 = gpu_data::size((gpu_data *)__dest);
  if (sVar1 < (long)__src + in_R8) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xee);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/gpu_data.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::memcpy(gpu_data &, size_t, const gpu_data &, size_t, size_t)"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_1a0,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"dest_offset + num <= dest.size()");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_1a0,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_1d1 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffffbb0,t,in_stack_fffffffffffffba0);
    local_1d1 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  pvVar4 = (void *)((long)local_20 + local_28);
  pvVar5 = (void *)gpu_data::size(local_18);
  if (pvVar4 <= pvVar5) {
    if (local_28 != 0) {
      if (local_8 == local_18) {
        puVar6 = std::max<unsigned_long>((unsigned_long *)&local_10,(unsigned_long *)&local_20);
        uVar10 = *puVar6;
        puVar6 = std::min<unsigned_long>((unsigned_long *)&local_10,(unsigned_long *)&local_20);
        if (uVar10 < *puVar6 + local_28) {
          if (local_10 == local_20) {
            return local_10;
          }
          pfVar7 = gpu_data::host(in_stack_fffffffffffffb90);
          pfVar7 = pfVar7 + (long)local_10;
          pfVar8 = gpu_data::host(in_stack_fffffffffffffb90);
          pvVar5 = memmove(pfVar7,pfVar8 + (long)local_20,local_28 << 2);
          return pvVar5;
        }
      }
      if ((local_10 == (void *)0x0) &&
         (sVar1 = local_28, sVar9 = gpu_data::size(local_8), sVar1 == sVar9)) {
        pfVar7 = gpu_data::host_write_only((gpu_data *)0x1ceb72);
        pfVar8 = gpu_data::host(in_stack_fffffffffffffb90);
        pvVar4 = ::memcpy(pfVar7,pfVar8 + (long)local_20,local_28 << 2);
      }
      else {
        pfVar7 = gpu_data::host(in_stack_fffffffffffffb90);
        this = (gpu_data *)(pfVar7 + (long)local_10);
        pfVar7 = gpu_data::host(this);
        pvVar4 = ::memcpy(this,pfVar7 + (long)local_20,local_28 << 2);
      }
    }
    return pvVar4;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_350);
  poVar2 = std::operator<<((ostream *)local_350,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xef);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_350,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/gpu_data.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_350,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::memcpy(gpu_data &, size_t, const gpu_data &, size_t, size_t)"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)local_350,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"src_offset + num <= src.size()");
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_350,std::boolalpha);
  poVar2 = std::operator<<(poVar2,"");
  std::operator<<(poVar2,"\n");
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error(in_stack_fffffffffffffbb0,t,in_stack_fffffffffffffba0);
  __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

inline void memcpy (
        gpu_data& dest, 
        size_t dest_offset,
        const gpu_data& src,
        size_t src_offset,
        size_t num
    )
    {
        DLIB_CASSERT(dest_offset + num <= dest.size());
        DLIB_CASSERT(src_offset + num <= src.size());
        if (num == 0)
            return;
        if (&dest == &src && std::max(dest_offset, src_offset) < std::min(dest_offset,src_offset)+num)
        {
            // if they perfectly alias each other then there is nothing to do
            if (dest_offset == src_offset)
                return;
            else
                std::memmove(dest.host()+dest_offset, src.host()+src_offset, sizeof(float)*num);
        }
        else
        {
            // if we write to the entire thing then we can use host_write_only()
            if (dest_offset == 0 && num == dest.size())
                std::memcpy(dest.host_write_only(), src.host()+src_offset, sizeof(float)*num);
            else
                std::memcpy(dest.host()+dest_offset, src.host()+src_offset, sizeof(float)*num);
        }
    }